

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O0

int enet_protocol_receive_incoming_commands(ENetHost *host,ENetEvent *event)

{
  int iVar1;
  int *in_RSI;
  long in_RDI;
  ENetBuffer buffer;
  int receivedLength;
  int packets;
  ENetSocket in_stack_00000030;
  ENetEvent *in_stack_00000050;
  ENetHost *in_stack_00000058;
  int local_1c;
  
  local_1c = 0;
  do {
    if (0xff < local_1c) {
      return -1;
    }
    iVar1 = enet_socket_receive(in_stack_00000030,(ENetAddress *)host,(ENetBuffer *)event,
                                _receivedLength);
    if (iVar1 < 0) {
      return -1;
    }
    if (iVar1 == 0) {
      return 0;
    }
    *(long *)(in_RDI + 0x2b00) = in_RDI + 0xaf8;
    *(long *)(in_RDI + 0x2b08) = (long)iVar1;
    *(int *)(in_RDI + 0x2b18) = iVar1 + *(int *)(in_RDI + 0x2b18);
    *(int *)(in_RDI + 0x2b1c) = *(int *)(in_RDI + 0x2b1c) + 1;
    if (*(long *)(in_RDI + 0x2b20) == 0) {
LAB_001092e3:
      iVar1 = enet_protocol_handle_incoming_commands(in_stack_00000058,in_stack_00000050);
      if (iVar1 == -1) {
        return -1;
      }
      if (iVar1 == 1) {
        return 1;
      }
    }
    else {
      iVar1 = (**(code **)(in_RDI + 0x2b20))(in_RDI,in_RSI);
      if (iVar1 == -1) {
        return -1;
      }
      if (iVar1 != 1) goto LAB_001092e3;
      if ((in_RSI != (int *)0x0) && (*in_RSI != 0)) {
        return 1;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

static int
enet_protocol_receive_incoming_commands (ENetHost * host, ENetEvent * event)
{
    int packets;

    for (packets = 0; packets < 256; ++ packets)
    {
       int receivedLength;
       ENetBuffer buffer;

       buffer.data = host -> packetData [0];
       buffer.dataLength = sizeof (host -> packetData [0]);

       receivedLength = enet_socket_receive (host -> socket,
                                             & host -> receivedAddress,
                                             & buffer,
                                             1);

       if (receivedLength < 0)
         return -1;

       if (receivedLength == 0)
         return 0;

       host -> receivedData = host -> packetData [0];
       host -> receivedDataLength = receivedLength;
      
       host -> totalReceivedData += receivedLength;
       host -> totalReceivedPackets ++;

       if (host -> intercept != NULL)
       {
          switch (host -> intercept (host, event))
          {
          case 1:
             if (event != NULL && event -> type != ENET_EVENT_TYPE_NONE)
               return 1;

             continue;
          
          case -1:
             return -1;
        
          default:
             break;
          }
       }
        
       switch (enet_protocol_handle_incoming_commands (host, event))
       {
       case 1:
          return 1;
       
       case -1:
          return -1;

       default:
          break;
       }
    }

    return -1;
}